

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorExtend.cpp
# Opt level: O0

void __thiscall HFactor::addRows(HFactor *this,HighsSparseMatrix *ar_matrix)

{
  value_type vVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  reference pvVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  reference pvVar9;
  uint *puVar10;
  long in_RSI;
  size_type sVar11;
  long in_RDI;
  bool bVar12;
  HighsInt iRow_7;
  HighsInt gap;
  HighsInt iRow_6;
  HighsInt iStart;
  HighsInt k;
  HighsInt iRow_5;
  vector<int,_std::allocator<int>_> ur_temp;
  HighsInt iRow_4;
  HighsInt ur_new_num_vec;
  HighsInt ur_cur_num_vec;
  HighsInt ur_count_size;
  HighsInt ur_size;
  HighsInt ur_stuff_size;
  HighsInt iRow_3;
  HighsInt u_pivot_lookup_offset;
  HighsInt u_countX;
  HighsInt iRow_2;
  HighsInt iEl_2;
  HighsInt iEl_1;
  HighsInt from_el;
  HighsInt iCol_5;
  HighsInt iCol_4;
  HighsInt to_el;
  HighsInt l_matrix_new_num_nz;
  HighsInt iCol_3;
  HighsSparseMatrix new_lr_cols;
  HighsInt iCol_2;
  HighsInt iX_1;
  HighsInt iCol_1;
  HighsInt iX;
  HighsInt rhs_num_nz;
  double local_density;
  HighsInt basis_index;
  HighsInt iCol;
  HighsInt iEl;
  HighsInt inewRow;
  HVector rhs;
  double expected_density;
  HighsSparseMatrix new_lr_rows;
  HighsInt iVar_1;
  HighsInt iRow_1;
  HighsInt iVar;
  HighsInt iRow;
  vector<int,_std::allocator<int>_> in_basis;
  HighsInt new_num_row;
  HighsInt num_new_row;
  undefined4 in_stack_fffffffffffffc78;
  value_type vVar13;
  undefined4 in_stack_fffffffffffffc7c;
  HVectorBase<double> *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  HighsInt in_stack_fffffffffffffc8c;
  HVectorBase<double> *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  HVectorBase<double> *in_stack_fffffffffffffca0;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  HVectorBase<double> *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  uint uVar14;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  int iVar15;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  vector<int,_std::allocator<int>_> local_298;
  uint local_280;
  int local_27c;
  uint local_278;
  uint local_274;
  uint local_270;
  int local_26c;
  undefined8 local_268;
  int local_25c;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  value_type local_234;
  value_type local_230;
  int local_22c;
  vector<int,_std::allocator<int>_> avStack_218 [2];
  vector<int,_std::allocator<int>_> vStack_1e8;
  vector<double,_std::allocator<double>_> vStack_1d0;
  undefined4 local_1b4;
  int local_1b0;
  int local_1ac;
  undefined4 local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  double local_198;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_17c;
  vector<int,_std::allocator<int>_> local_178;
  vector<double,_std::allocator<double>_> local_160 [3];
  undefined1 local_108;
  double local_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  int local_c0;
  vector<int,_std::allocator<int>_> local_88 [2];
  undefined4 local_54;
  int local_50;
  int local_4c;
  int local_48;
  undefined4 local_34;
  vector<int,_std::allocator<int>_> local_30;
  uint local_18;
  uint local_14;
  long local_10;
  
  local_10 = in_RSI;
  invalidAMatrixAction((HFactor *)0x7db3dc);
  local_14 = *(uint *)(local_10 + 8);
  local_18 = *(int *)(in_RDI + 200) + local_14;
  printf("Adding %d new rows to HFactor instance: increasing dimension from %d to %d \n",
         (ulong)local_14,(ulong)*(uint *)(in_RDI + 200),(ulong)local_18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7db443);
  local_34 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             (value_type_conflict2 *)0x7db472);
  for (local_48 = 0; iVar15 = local_48, local_48 < *(int *)(in_RDI + 200); local_48 = local_48 + 1)
  {
    local_4c = *(int *)(*(long *)(in_RDI + 0x100) + (long)local_48 * 4);
    if (local_4c < *(int *)(in_RDI + 0xcc)) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
      *pvVar6 = iVar15;
    }
  }
  for (local_50 = *(int *)(in_RDI + 200); local_50 < (int)local_18; local_50 = local_50 + 1) {
    local_54 = *(undefined4 *)(*(long *)(in_RDI + 0x100) + (long)local_50 * 4);
  }
  HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffffcb0);
  local_c8 = 2;
  local_c4 = *(undefined4 *)(in_RDI + 200);
  local_d0 = 0.0;
  HVectorBase<double>::HVectorBase(in_stack_fffffffffffffc80);
  HVectorBase<double>::setup(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0,
             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  for (local_184 = 0; local_184 < (int)local_14; local_184 = local_184 + 1) {
    HVectorBase<double>::clear(in_stack_fffffffffffffca0);
    local_108 = 1;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_10 + 0x10),(long)local_184);
    for (local_188 = *pvVar7; iVar15 = local_188,
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_10 + 0x10),
                            (long)(local_184 + 1)), iVar15 < *pvVar7; local_188 = local_188 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_10 + 0x40),(long)local_188);
      local_18c = *pvVar7;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_18c);
      local_190 = *pvVar6;
      if (-1 < local_190) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x58),
                            (long)local_188);
        vVar1 = *pvVar8;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_160,(long)local_190)
        ;
        iVar15 = local_190;
        *pvVar9 = vVar1;
        sVar11 = (size_type)local_17c;
        local_17c = local_17c + 1;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_178,sVar11);
        *pvVar6 = iVar15;
      }
    }
    btranU((HFactor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
           (HVector *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
           (double)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
           (HighsTimerClock *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_198 = (double)local_17c / (double)*(int *)(in_RDI + 200);
    local_d0 = local_198 * 0.05 + local_d0 * 0.95;
    HVectorBase<double>::tight(in_stack_fffffffffffffcb0);
    local_19c = local_17c;
    for (local_1a0 = 0; local_1a0 < local_19c; local_1a0 = local_1a0 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_178,(long)local_1a0);
      local_1a4 = *pvVar6;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      std::vector<double,_std::allocator<double>_>::operator[](local_160,(long)local_1a4);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc90,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    }
    sVar11 = std::vector<int,_std::allocator<int>_>::size(local_88);
    local_1a8 = (undefined4)sVar11;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
              );
    local_c0 = local_c0 + 1;
    for (local_1ac = 0; local_1ac < local_19c; local_1ac = local_1ac + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_178,(long)local_1ac);
      local_1b0 = *pvVar6;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      std::vector<double,_std::allocator<double>_>::operator[](local_160,(long)local_1b0);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc90,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    }
    sVar11 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4f8));
    local_1b4 = (undefined4)sVar11;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
              );
  }
  HighsSparseMatrix::HighsSparseMatrix
            ((HighsSparseMatrix *)in_stack_fffffffffffffcb0,
             (HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  HighsSparseMatrix::ensureColwise
            ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  for (local_22c = *(int *)(in_RDI + 200); iVar15 = local_22c, local_22c < (int)local_18;
      local_22c = local_22c + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x480),(long)local_22c);
    *pvVar6 = iVar15;
  }
  sVar11 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4f8));
  local_230 = (value_type)sVar11;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_234 = local_230;
  local_238 = *(int *)(in_RDI + 200);
  while (vVar13 = local_230, local_238 = local_238 + 1, local_238 < (int)(local_18 + 1)) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x498),(long)local_238);
    *pvVar6 = vVar13;
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  iVar15 = *(int *)(in_RDI + 200);
  while (local_23c = iVar15 + -1, -1 < local_23c) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x498),(long)iVar15);
    vVar13 = local_234;
    local_240 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x498),(long)(local_23c + 1))
    ;
    *pvVar6 = vVar13;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](avStack_218,(long)(local_23c + 1));
    local_244 = *pvVar6;
    while( true ) {
      local_244 = local_244 + -1;
      iVar2 = local_244;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](avStack_218,(long)local_23c);
      iVar15 = local_240;
      if (iVar2 < *pvVar6) break;
      local_234 = local_234 + -1;
      iVar15 = *(int *)(in_RDI + 200);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_1e8,(long)local_244);
      iVar2 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0),(long)local_234);
      *pvVar6 = iVar15 + iVar2;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&vStack_1d0,(long)local_244)
      ;
      vVar1 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4c8),
                          (long)local_234);
      *pvVar9 = vVar1;
    }
    while( true ) {
      local_248 = iVar15 + -1;
      iVar2 = local_248;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x498),(long)local_23c);
      iVar15 = local_23c;
      if (iVar2 < *pvVar6) break;
      local_234 = local_234 + -1;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0),(long)local_248);
      vVar13 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0),(long)local_234);
      *pvVar6 = vVar13;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4c8),
                          (long)local_248);
      vVar1 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4c8),
                          (long)local_234);
      *pvVar9 = vVar1;
      iVar15 = local_248;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  for (local_24c = *(int *)(in_RDI + 200); iVar15 = local_24c, local_24c < (int)local_18;
      local_24c = local_24c + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x480),(long)local_24c);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x468),(long)*pvVar6);
    *pvVar6 = iVar15;
  }
  sVar11 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
  local_250 = (int)sVar11;
  sVar11 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x540));
  local_254 = (int)sVar11 - *(int *)(in_RDI + 200);
  for (local_258 = *(int *)(in_RDI + 200); local_258 < (int)local_18; local_258 = local_258 + 1) {
    local_25c = local_254 + local_258;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
              );
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90,
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
              );
    local_268 = 0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc80,
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
              );
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90,
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
              );
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90,
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
              );
  }
  bVar12 = *(int *)(in_RDI + 0x198) == 1;
  local_26c = (uint)bVar12 + (uint)bVar12 * 4;
  sVar11 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x620));
  local_270 = (uint)sVar11;
  local_274 = local_270 + local_26c * local_14;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  sVar11 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8));
  local_278 = (uint)sVar11;
  local_27c = local_278 + local_14;
  printf("\nUpdating UR vectors %d - %d\n",sVar11 & 0xffffffff,(ulong)(local_27c - 1));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_280 = local_278;
  while (local_280 = local_280 + 1, (int)local_280 < local_27c + 1) {
    uVar3 = local_270;
    puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),
                                 (long)(int)local_280);
    *puVar10 = uVar3;
  }
  this_00 = &local_298;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7dc21a);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             (value_type_conflict2 *)0x7dc23f);
  std::vector<int,_std::allocator<int>_>::resize
            (this_00,CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  for (uVar3 = local_278; (int)uVar3 < local_27c; uVar3 = uVar3 + 1) {
    in_stack_fffffffffffffc9c = local_26c;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x608),(long)(int)uVar3);
    *pvVar6 = in_stack_fffffffffffffc9c;
  }
  for (iVar15 = 0; iVar15 < local_250; iVar15 = iVar15 + 1) {
    in_stack_fffffffffffffc90 = (HVectorBase<double> *)(in_RDI + 0x528);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8),(long)iVar15);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90,(long)*pvVar6
                       );
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_298,(long)*pvVar6);
    *pvVar6 = *pvVar6 + 1;
  }
  uVar3 = local_270;
  uVar5 = local_270;
  puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),
                               (long)(int)local_278);
  *puVar10 = uVar3;
  uVar3 = local_278;
  while (uVar14 = uVar3 + 1, (int)uVar14 < local_27c + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_298,(long)(int)uVar3);
    uVar4 = *pvVar6 + local_26c;
    iVar15 = uVar5 + uVar4;
    in_stack_fffffffffffffc80 = (HVectorBase<double> *)(in_RDI + 0x5d8);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
                        (long)(int)uVar14);
    *pvVar6 = iVar15;
    uVar5 = uVar5 + uVar4;
    uVar3 = uVar14;
    puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
                                 (long)(int)uVar14);
    printf("ur_start[%d] = %d; gap = %d; iStart = %d\n",(ulong)uVar14,(ulong)*puVar10,(ulong)uVar4,
           (ulong)uVar5);
  }
  printf("ur_count_size = %d; iStart%d\n",(ulong)local_274,(ulong)uVar5);
  std::vector<int,_std::allocator<int>_>::resize
            (this_00,CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  std::vector<int,_std::allocator<int>_>::resize
            (this_00,CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  for (uVar3 = local_278; (int)uVar3 < local_27c; uVar3 = uVar3 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),(long)(int)uVar3);
    vVar13 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5f0),(long)(int)uVar3);
    *pvVar6 = vVar13;
  }
  *(uint *)(in_RDI + 200) = local_14 + *(int *)(in_RDI + 200);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90);
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffffc80);
  HVectorBase<double>::~HVectorBase(in_stack_fffffffffffffc80);
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffffc80);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90);
  return;
}

Assistant:

void HFactor::addRows(const HighsSparseMatrix* ar_matrix) {
  invalidAMatrixAction();
  assert(kExtendInvertWhenAddingRows);
  HighsInt num_new_row = ar_matrix->num_row_;
  HighsInt new_num_row = num_row + num_new_row;
  printf("Adding %" HIGHSINT_FORMAT
         " new rows to HFactor instance: increasing dimension from "
         "%" HIGHSINT_FORMAT " to %" HIGHSINT_FORMAT " \n",
         num_new_row, num_row, new_num_row);

  // Need to know where (if) a column is basic
  vector<HighsInt> in_basis;
  in_basis.assign(num_col, -1);
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt iVar = basic_index[iRow];
    if (iVar < num_col) in_basis[iVar] = iRow;
  }
  for (HighsInt iRow = num_row; iRow < new_num_row; iRow++) {
    HighsInt iVar = basic_index[iRow];
    assert(iVar >= num_col);
  }
  //  reportLu(kReportLuBoth, true);
  //  reportLu(kReportLuJustL);

  // Create a row-wise sparse matrix containing the new rows of the L
  // matrix - so that a column-wise version can be created (after
  // inserting the rows into the LR matrix) allowing the cew column
  // entries to be inserted efficiently into the L matrix
  HighsSparseMatrix new_lr_rows;
  new_lr_rows.format_ = MatrixFormat::kRowwise;
  new_lr_rows.num_col_ = num_row;
  double expected_density = 0.0;
  HVector rhs;
  rhs.setup(num_row);
  this->lr_start.reserve(new_num_row + 1);
  for (HighsInt inewRow = 0; inewRow < num_new_row; inewRow++) {
    //    printf("\nFor new row %" HIGHSINT_FORMAT "\n", inewRow);
    // Prepare RHS for system U^T.v = r
    rhs.clear();
    rhs.packFlag = true;
    for (HighsInt iEl = ar_matrix->start_[inewRow];
         iEl < ar_matrix->start_[inewRow + 1]; iEl++) {
      HighsInt iCol = ar_matrix->index_[iEl];
      HighsInt basis_index = in_basis[iCol];
      if (basis_index >= 0) {
        rhs.array[basis_index] = ar_matrix->value_[iEl];
        rhs.index[rhs.count++] = basis_index;
      }
    }
    // Solve U^T.v = r
    btranU(rhs, expected_density);
    double local_density = (1.0 * rhs.count) / num_row;
    expected_density = kRunningAverageMultiplier * local_density +
                       (1 - kRunningAverageMultiplier) * expected_density;
    //    printf("New row btranU density: local = %11.4g; expected =  %11.4g\n",
    //    local_density, expected_density);
    rhs.tight();
    //
    // Append v to the matrix containing the new rows of L
    HighsInt rhs_num_nz = rhs.count;
    //    printf("New row has entries:\n");
    for (HighsInt iX = 0; iX < rhs_num_nz; iX++) {
      HighsInt iCol = rhs.index[iX];
      new_lr_rows.index_.push_back(iCol);
      new_lr_rows.value_.push_back(rhs.array[iCol]);
      //      printf("   %4d, %11.4g\n", (int)iCol, rhs.array[iCol]);
    }
    new_lr_rows.start_.push_back(new_lr_rows.index_.size());
    new_lr_rows.num_row_++;

    //
    // Append v to the L matrix
    for (HighsInt iX = 0; iX < rhs_num_nz; iX++) {
      HighsInt iCol = rhs.index[iX];
      lr_index.push_back(iCol);
      lr_value.push_back(rhs.array[iCol]);
    }
    lr_start.push_back(lr_index.size());
    //    reportLu(kReportLuJustL);
  }
  // Now create a column-wise copy of the new rows
  HighsSparseMatrix new_lr_cols = new_lr_rows;
  new_lr_cols.ensureColwise();
  //
  // Insert the column-wise copy into the L matrix
  //
  // Add pivot indices for the new columns
  this->l_pivot_index.resize(new_num_row);
  for (HighsInt iCol = num_row; iCol < new_num_row; iCol++)
    l_pivot_index[iCol] = iCol;
  //
  // Add starts for the identity columns
  HighsInt l_matrix_new_num_nz = lr_index.size();
  assert(l_matrix_new_num_nz ==
         (HighsInt)(l_index.size() + new_lr_cols.index_.size()));
  l_start.resize(new_num_row + 1);
  HighsInt to_el = l_matrix_new_num_nz;
  for (HighsInt iCol = num_row + 1; iCol < new_num_row + 1; iCol++)
    l_start[iCol] = l_matrix_new_num_nz;
  //
  // Insert the new entries, remembering to offset the index values by
  // num_row, since new_lr_cols only has the new rows
  l_index.resize(l_matrix_new_num_nz);
  l_value.resize(l_matrix_new_num_nz);
  for (HighsInt iCol = num_row - 1; iCol >= 0; iCol--) {
    const HighsInt from_el = l_start[iCol + 1];
    l_start[iCol + 1] = to_el;
    for (HighsInt iEl = new_lr_cols.start_[iCol + 1] - 1;
         iEl >= new_lr_cols.start_[iCol]; iEl--) {
      to_el--;
      l_index[to_el] = num_row + new_lr_cols.index_[iEl];
      l_value[to_el] = new_lr_cols.value_[iEl];
    }
    for (HighsInt iEl = from_el - 1; iEl >= l_start[iCol]; iEl--) {
      to_el--;
      l_index[to_el] = l_index[iEl];
      l_value[to_el] = l_value[iEl];
    }
  }
  assert(to_el == 0);
  this->l_pivot_lookup.resize(new_num_row);
  for (HighsInt iRow = num_row; iRow < new_num_row; iRow++)
    l_pivot_lookup[l_pivot_index[iRow]] = iRow;
  // Now update the U matrix with identity rows and columns
  // Allocate space for U factor
  //  reportLu(kReportLuJustL);
  //
  // Now add pivots corresponding to identity columns in U. The use of
  // most arrays in U is self-evident, except for U(R)lastp, which is
  // (one more than) the end of the index/value array that's applied
  // in the *tranU. Here it needs to be equal to the start since there
  // are no non-pivotal entries
  //

  HighsInt u_countX = u_index.size();
  HighsInt u_pivot_lookup_offset = u_pivot_index.size() - num_row;
  for (HighsInt iRow = num_row; iRow < new_num_row; iRow++) {
    u_pivot_lookup.push_back(u_pivot_lookup_offset + iRow);
    u_pivot_index.push_back(iRow);
    u_pivot_value.push_back(1);
    u_start.push_back(u_countX);
    u_last_p.push_back(u_countX);
  }

  // Now, to extend UR
  //
  // UR space
  //
  // Borrowing names from buildFinish()
  HighsInt ur_stuff_size = update_method == kUpdateMethodFt ? 5 : 0;
  HighsInt ur_size = ur_index.size();
  HighsInt ur_count_size = ur_size + ur_stuff_size * num_new_row;
  ur_index.resize(ur_count_size);
  ur_value.resize(ur_count_size);

  // Need to refer to just the new UR vectors
  HighsInt ur_cur_num_vec = ur_start.size();
  HighsInt ur_new_num_vec = ur_cur_num_vec + num_new_row;
  printf("\nUpdating UR vectors %d - %d\n", (int)ur_cur_num_vec,
         (int)ur_new_num_vec - 1);
  // UR pointer
  //
  // Allow space to the start of new rows, including the start for the
  // fictitious ur_new_num_vec'th row
  ur_start.resize(ur_new_num_vec + 1);
  for (HighsInt iRow = ur_cur_num_vec + 1; iRow < ur_new_num_vec + 1; iRow++) {
    ur_start[iRow] = ur_size;
  }
  // NB ur_temp plays the role of ur_lastp when it could be used as
  // temporary storage in buildFinish()
  vector<HighsInt> ur_temp;
  ur_temp.assign(ur_new_num_vec, 0);
  //
  // ur_space has its new entries assigned (to ur_stuff_size) as in
  // buildFinish()
  ur_space.resize(ur_new_num_vec);
  for (HighsInt iRow = ur_cur_num_vec; iRow < ur_new_num_vec; iRow++)
    ur_space[iRow] = ur_stuff_size;
  // Compute ur_temp exactly as in buildFinish()
  for (HighsInt k = 0; k < u_countX; k++) ur_temp[u_pivot_lookup[u_index[k]]]++;
  HighsInt iStart = ur_size;
  ur_start[ur_cur_num_vec] = iStart;
  for (HighsInt iRow = ur_cur_num_vec + 1; iRow < ur_new_num_vec + 1; iRow++) {
    HighsInt gap = ur_temp[iRow - 1] + ur_stuff_size;
    ur_start[iRow] = iStart + gap;
    iStart += gap;
    printf("ur_start[%d] = %d; gap = %d; iStart = %d\n", (int)iRow,
           (int)ur_start[iRow], (int)gap, (int)iStart);
  }
  printf("ur_count_size = %d; iStart%d\n", (int)ur_count_size, (int)iStart);
  // Lose the start for the fictitious ur_new_num_vec'th row
  ur_start.resize(ur_new_num_vec);
  // Resize ur_lastp and initialise its new entries to be the ur_start
  // values since the rows are empty
  ur_lastp.resize(ur_new_num_vec);
  for (HighsInt iRow = ur_cur_num_vec; iRow < ur_new_num_vec; iRow++)
    ur_lastp[iRow] = ur_start[iRow];
  //
  // Increase the number of rows in HFactor
  num_row += num_new_row;
  //  reportLu(kReportLuBoth, true);
}